

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int compare2pow63(char *zNum,int incr)

{
  int iVar1;
  long lVar2;
  char *pow63;
  int local_18;
  int i;
  int c;
  int incr_local;
  char *zNum_local;
  
  pow63._4_4_ = 0;
  local_18 = 0;
  while (local_18 == 0 && pow63._4_4_ < 0x12) {
    iVar1 = pow63._4_4_ * incr;
    lVar2 = (long)pow63._4_4_;
    pow63._4_4_ = pow63._4_4_ + 1;
    local_18 = ((int)zNum[iVar1] - (int)"922337203685477580"[lVar2]) * 10;
  }
  if (local_18 == 0) {
    local_18 = zNum[incr * 0x12] + -0x38;
  }
  return local_18;
}

Assistant:

static int compare2pow63(const char *zNum, int incr){
  int c = 0;
  int i;
                    /* 012345678901234567 */
  const char *pow63 = "922337203685477580";
  for(i=0; c==0 && i<18; i++){
    c = (zNum[i*incr]-pow63[i])*10;
  }
  if( c==0 ){
    c = zNum[18*incr] - '8';
    testcase( c==(-1) );
    testcase( c==0 );
    testcase( c==(+1) );
  }
  return c;
}